

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<IntraPredFunc<void(*)(unsigned_short*,long,unsigned_short_const*,unsigned_short_const*,int)>>::Iterator_const,testing::internal::ParamIteratorInterface<IntraPredFunc<void(*)(unsigned_short*,long,unsigned_short_const*,unsigned_short_const*,int)>>const>
          (ParamIteratorInterface<IntraPredFunc<void_(*)(unsigned_short_*,_long,_const_unsigned_short_*,_const_unsigned_short_*,_int)>_>
           *base)

{
  bool bVar1;
  Iterator *pIVar2;
  undefined8 uVar3;
  GTestLog local_c;
  
  if (base != (ParamIteratorInterface<IntraPredFunc<void_(*)(unsigned_short_*,_long,_const_unsigned_short_*,_const_unsigned_short_*,_int)>_>
               *)0x0) {
    bVar1 = std::type_info::operator==
                      ((type_info *)base->_vptr_ParamIteratorInterface[-1],
                       (type_info *)
                       &ValuesInIteratorRangeGenerator<IntraPredFunc<void(*)(unsigned_short*,long,unsigned_short_const*,unsigned_short_const*,int)>>
                        ::Iterator::typeinfo);
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::operator<<((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ");
      GTestLog::~GTestLog(&local_c);
    }
    pIVar2 = (Iterator *)
             __dynamic_cast(base,&ParamIteratorInterface<IntraPredFunc<void(*)(unsigned_short*,long,unsigned_short_const*,unsigned_short_const*,int)>>
                                  ::typeinfo,
                            &ValuesInIteratorRangeGenerator<IntraPredFunc<void(*)(unsigned_short*,long,unsigned_short_const*,unsigned_short_const*,int)>>
                             ::Iterator::typeinfo,0);
    return pIVar2;
  }
  uVar3 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar3);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}